

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfbs_gen_nim.cpp
# Opt level: O0

void __thiscall
flatbuffers::anon_unknown_0::NimBfbsGenerator::~NimBfbsGenerator(NimBfbsGenerator *this)

{
  NimBfbsGenerator *this_local;
  
  (this->super_BaseBfbsGenerator).super_CodeGenerator._vptr_CodeGenerator =
       (_func_int **)&PTR__NimBfbsGenerator_004fbb38;
  BfbsNamer::~BfbsNamer(&this->namer_);
  std::__cxx11::string::~string((string *)&this->flatc_version_);
  CodeGenOptions::~CodeGenOptions(&this->options_);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map(&this->imports_);
  std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unordered_set(&this->keywords_);
  BaseBfbsGenerator::~BaseBfbsGenerator(&this->super_BaseBfbsGenerator);
  return;
}

Assistant:

explicit NimBfbsGenerator(const std::string &flatc_version)
      : BaseBfbsGenerator(),
        keywords_(),
        imports_(),
        current_obj_(nullptr),
        current_enum_(nullptr),
        flatc_version_(flatc_version),
        namer_(NimDefaultConfig(), NimKeywords()) {}